

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O0

void __thiscall CFGGrindReader::~CFGGrindReader(CFGGrindReader *this)

{
  CFGGrindReader *this_local;
  
  ~CFGGrindReader(this);
  operator_delete(this);
  return;
}

Assistant:

CFGGrindReader::~CFGGrindReader() {
}